

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generator.hpp
# Opt level: O1

void __thiscall
boost::uuids::
basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
::basic_random_generator
          (basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
           *this)

{
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  *pmVar1;
  
  pmVar1 = (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
            *)operator_new(0x9c8);
  random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(pmVar1,&random::
                 mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
                 ::default_seed);
  shared_ptr<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
  ::
  shared_ptr<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
            ((shared_ptr<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
              *)this,pmVar1);
  pmVar1 = (this->pURNG).px;
  (this->generator)._eng = pmVar1;
  (this->generator)._dist.super_uniform_int_distribution<unsigned_long>._min = 0;
  (this->generator)._dist.super_uniform_int_distribution<unsigned_long>._max = 0xffffffffffffffff;
  if (pmVar1 != (mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                 *)0x0) {
    detail::
    seed<boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
              (pmVar1);
    return;
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2d8,
                "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<boost::random::mersenne_twister_engine<unsigned int, 32, 624, 397, 31, 2567483615, 11, 4294967295, 7, 2636928640, 15, 4022730752, 18, 1812433253>>::operator*() const [T = boost::random::mersenne_twister_engine<unsigned int, 32, 624, 397, 31, 2567483615, 11, 4294967295, 7, 2636928640, 15, 4022730752, 18, 1812433253>]"
               );
}

Assistant:

basic_random_generator()
        : pURNG(new UniformRandomNumberGenerator)
        , generator
          ( pURNG.get()
          , distribution_type
            ( (std::numeric_limits<unsigned long>::min)()
            , (std::numeric_limits<unsigned long>::max)()
            )
          )
    {
        // seed the random number generator
        detail::seed(*pURNG);
    }